

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O3

iterator * __thiscall
QPDFNumberTreeObjectHelper::insert
          (iterator *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this,numtree_number key,
          QPDFObjectHandle *value)

{
  NNTreeImpl *this_00;
  iterator i;
  undefined1 local_a9;
  NNTreeIterator *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  iterator local_78;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newInteger(&local_88,key);
  local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (value->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (value->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  NNTreeImpl::insert(&local_78,this_00,&local_88,&local_98);
  if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_a8 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NNTreeIterator,std::allocator<NNTreeIterator>,NNTreeIterator&>
            (&local_a0,&local_a8,(allocator<NNTreeIterator> *)&local_a9,&local_78);
  __return_storage_ptr__->_vptr_iterator = (_func_int **)&PTR__iterator_002ed8f8;
  (__return_storage_ptr__->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_a8;
  (__return_storage_ptr__->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_a0._M_pi;
  if (local_a0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->ivalue).first = 0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      UNLOCK();
      (__return_storage_ptr__->ivalue).first = 0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_a0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001bd235;
    }
    else {
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      (__return_storage_ptr__->ivalue).first = 0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
LAB_001bd235:
  NNTreeIterator::~NNTreeIterator(&local_78);
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator
QPDFNumberTreeObjectHelper::insert(numtree_number key, QPDFObjectHandle value)
{
    auto i = m->impl->insert(QPDFObjectHandle::newInteger(key), value);
    return {std::make_shared<NNTreeIterator>(i)};
}